

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

Value * __thiscall Kvm::defineVariable(Kvm *this,Value *var,Value *val,Value *env)

{
  Value *frame;
  Value *pVVar1;
  Value *v;
  
  frame = (Value *)env[1]._vptr_Value;
  pVVar1 = (Value *)frame[1]._vptr_Value;
  v = frame;
  while( true ) {
    if (pVVar1 == this->NIL) {
      addBindingToFrame(this,var,val,frame);
      return var;
    }
    v = *(Value **)&v[1].type_;
    if ((Value *)pVVar1[1]._vptr_Value == var) break;
    pVVar1 = *(Value **)&pVVar1[1].type_;
  }
  set_car(v,val);
  return var;
}

Assistant:

const Value * Kvm::defineVariable(const Value *var, const Value *val, const Value *env)
{
    auto frame = firstFrame(env);
    auto variables = frameVariables(frame);
    auto values = frameValues(frame);
    while (variables != NIL)
    {
        if (var == car(variables))
        {
            set_car(const_cast<Value *>(values), val);
            return var;
        }
        variables = cdr(variables);
        values = cdr(values);
    }
    addBindingToFrame(var, val, frame);
    return var;
}